

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::Argument_Binding::CheckTypeAndMergeFrom
          (Argument_Binding *this,MessageLite *from)

{
  int iVar1;
  ulong uVar2;
  LogMessage *other;
  Value *pVVar3;
  undefined8 *puVar4;
  undefined1 *from_00;
  Arena *arena;
  undefined8 *puVar5;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__Argument_Binding_004b17c8) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::MILSpec::Argument_Binding *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((Argument_Binding *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
               ,0x7c1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  iVar1 = *(int *)((long)&from[1]._internal_metadata_.ptr_ + 4);
  if (iVar1 == 1) {
    if (iVar1 == 1) {
      puVar5 = (undefined8 *)((ulong)from[1]._vptr_MessageLite & 0xfffffffffffffffe);
    }
    else {
      puVar5 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if (this->_oneof_case_[0] != 1) {
      clear_binding(this);
      this->_oneof_case_[0] = 1;
      (this->binding_).value_ =
           (Value *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&this->binding_,puVar5,puVar4)
    ;
  }
  else if (iVar1 == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_binding(this);
      this->_oneof_case_[0] = 2;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pVVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::Value>
                         (arena);
      (this->binding_).value_ = pVVar3;
    }
    if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 2) {
      from_00 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      from_00 = _Value_default_instance_;
    }
    Value::MergeFrom((this->binding_).value_,(Value *)from_00);
  }
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}